

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

char * dfeature_at(int x,int y,char *buf)

{
  char cVar1;
  level *plVar2;
  boolean bVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char local_48;
  aligntyp local_44;
  char *local_30;
  char *dfeature;
  int cmap;
  int ltyp;
  rm *loc;
  char *buf_local;
  int y_local;
  int x_local;
  
  plVar2 = level;
  cVar1 = level->locations[x][y].typ;
  dfeature._0_4_ = -1;
  local_30 = (char *)0x0;
  if (cVar1 == '\x17') {
    uVar4 = *(uint *)&level->locations[x][y].field_0x6 >> 4 & 0x1f;
    if (uVar4 == 0) {
      dfeature._0_4_ = 0x18;
    }
    else if (uVar4 == 1) {
      local_30 = "broken door";
    }
    else if (uVar4 == 2) {
      dfeature._0_4_ = 0x19;
    }
    else {
      dfeature._0_4_ = 0x1b;
    }
    iVar5 = is_drawbridge_wall(x,y);
    if (-1 < iVar5) {
      local_30 = "open drawbridge portcullis";
      dfeature._0_4_ = -1;
    }
  }
  else if (cVar1 == '\x1c') {
    dfeature._0_4_ = 0x2b;
  }
  else if (cVar1 == '\x1d') {
    dfeature._0_4_ = 0x28;
  }
  else if (cVar1 == '\x1e') {
    dfeature._0_4_ = 0x29;
  }
  else {
    bVar3 = is_lava(level,x,y);
    if (bVar3 == '\0') {
      bVar3 = is_swamp(level,x,y);
      if (bVar3 == '\0') {
        bVar3 = is_ice(level,x,y);
        if (bVar3 == '\0') {
          bVar3 = is_pool(level,x,y);
          if (bVar3 == '\0') {
            if (cVar1 == '\x1f') {
              dfeature._0_4_ = 0x2a;
            }
            else if (cVar1 == '!') {
              pcVar6 = a_gname();
              if ((*(uint *)&plVar2->locations[x][y].field_0x6 >> 4 & 0x17) == 0) {
                local_44 = -0x80;
              }
              else {
                if ((*(uint *)&plVar2->locations[x][y].field_0x6 >> 4 & 0x17) == 4) {
                  local_48 = '\x01';
                }
                else {
                  local_48 = ((byte)(*(uint *)&plVar2->locations[x][y].field_0x6 >> 4) & 0x17) - 2;
                }
                local_44 = local_48;
              }
              pcVar7 = align_str(local_44);
              sprintf(dfeature_at::altbuf,"altar to %s (%s)",pcVar6,pcVar7);
              local_30 = dfeature_at::altbuf;
            }
            else if (((x == (level->sstairs).sx) && (y == (level->sstairs).sy)) &&
                    ((level->sstairs).up != '\0')) {
              dfeature._0_4_ = 0x24;
            }
            else if ((x == (level->sstairs).sx) && (y == (level->sstairs).sy)) {
              dfeature._0_4_ = 0x25;
            }
            else if ((x == (level->upstair).sx) && (y == (level->upstair).sy)) {
              dfeature._0_4_ = 0x20;
            }
            else if ((x == (level->dnstair).sx) && (y == (level->dnstair).sy)) {
              dfeature._0_4_ = 0x21;
            }
            else if ((x == (level->upladder).sx) && (y == (level->upladder).sy)) {
              dfeature._0_4_ = 0x22;
            }
            else if ((x == (level->dnladder).sx) && (y == (level->dnladder).sy)) {
              dfeature._0_4_ = 0x23;
            }
            else if (cVar1 == '$') {
              dfeature._0_4_ = 0x2c;
            }
            else if (cVar1 == '\f') {
              dfeature._0_4_ = 0x2e;
            }
            else if (cVar1 == ' ') {
              dfeature._0_4_ = 0x27;
            }
            else if (cVar1 == '\r') {
              dfeature._0_4_ = 0x1e;
            }
            else if (cVar1 == '\x0e') {
              dfeature._0_4_ = 0x1f;
            }
            else if (cVar1 == '\x16') {
              local_30 = "set of iron bars";
            }
          }
          else {
            local_30 = "pool of water";
          }
        }
        else {
          dfeature._0_4_ = 0x15;
        }
      }
      else {
        dfeature._0_4_ = 0x16;
      }
    }
    else {
      dfeature._0_4_ = 0x17;
    }
  }
  if (-1 < (int)dfeature) {
    local_30 = defexplain[(int)dfeature];
  }
  if (local_30 != (char *)0x0) {
    strcpy(buf,local_30);
  }
  return local_30;
}

Assistant:

const char *dfeature_at(int x, int y, char *buf)
{
	struct rm *loc = &level->locations[x][y];
	int ltyp = loc->typ, cmap = -1;
	const char *dfeature = 0;
	static char altbuf[BUFSZ];

	if (IS_DOOR(ltyp)) {
	    switch (loc->doormask) {
	    case D_NODOOR:	cmap = S_ndoor; break;	/* "doorway" */
	    case D_ISOPEN:	cmap = S_vodoor; break;	/* "open door" */
	    case D_BROKEN:	dfeature = "broken door"; break;
	    default:	cmap = S_vcdoor; break;	/* "closed door" */
	    }
	    /* override door description for open drawbridge */
	    if (is_drawbridge_wall(x, y) >= 0)
		dfeature = "open drawbridge portcullis",  cmap = -1;
	} else if (IS_FOUNTAIN(ltyp))
	    cmap = S_fountain;				/* "fountain" */
	else if (IS_THRONE(ltyp))
	    cmap = S_throne;				/* "opulent throne" */
	else if (IS_MAGIC_CHEST(ltyp))
	    cmap = S_magic_chest;			/* "magic chest" */
	else if (is_lava(level, x,y))
	    cmap = S_lava;				/* "molten lava" */
	else if (is_swamp(level, x,y))
	    cmap = S_bog;				/* "muddy swamp" */
	else if (is_ice(level, x, y))
	    cmap = S_ice;				/* "ice" */
	else if (is_pool(level, x,y))
	    dfeature = "pool of water";
	else if (IS_SINK(ltyp))
	    cmap = S_sink;				/* "sink" */
	else if (IS_ALTAR(ltyp)) {
	    sprintf(altbuf, "altar to %s (%s)", a_gname(),
		    align_str(Amask2align(loc->altarmask & ~AM_SHRINE)));
	    dfeature = altbuf;
	} else if (x == level->sstairs.sx && y == level->sstairs.sy && level->sstairs.up)
            cmap = S_upsstair;                          /* "long ladder up" */
        else if (x == level->sstairs.sx && y == level->sstairs.sy)
            cmap = S_dnsstair;                          /* "long ladder down" */
        else if (x == level->upstair.sx && y == level->upstair.sy)
	    cmap = S_upstair;				/* "staircase up" */
	else if (x == level->dnstair.sx && y == level->dnstair.sy)
	    cmap = S_dnstair;				/* "staircase down" */
	else if (x == level->upladder.sx && y == level->upladder.sy)
	    cmap = S_upladder;				/* "ladder up" */
	else if (x == level->dnladder.sx && y == level->dnladder.sy)
	    cmap = S_dnladder;				/* "ladder down" */
	else if (ltyp == DRAWBRIDGE_DOWN)
	    cmap = S_vodbridge;			/* "lowered drawbridge" */
	else if (ltyp == DBWALL)
	    cmap = S_vcdbridge;			/* "raised drawbridge" */
	else if (IS_GRAVE(ltyp))
	    cmap = S_grave;				/* "grave" */
	else if (ltyp == TREE)
	    cmap = S_tree;				/* "tree" */
	else if (ltyp == DEADTREE)
	    cmap = S_deadtree;				/* "dead tree" */
	else if (ltyp == IRONBARS)
	    dfeature = "set of iron bars";

	if (cmap >= 0) dfeature = defexplain[cmap];
	if (dfeature) strcpy(buf, dfeature);
	return dfeature;
}